

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O2

void __thiscall ON_V5x_DimStyle::ON_V5x_DimStyle(ON_V5x_DimStyle *this)

{
  ON_Color OVar1;
  
  ON_ModelComponent::ON_ModelComponent(&this->super_ON_ModelComponent,DimStyle);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00824350;
  this->m_extextension = 0.5;
  this->m_extoffset = 0.5;
  this->m_arrowsize = 1.0;
  this->m_centermark = 0.5;
  this->m_textgap = 0.25;
  this->m_textheight = 1.0;
  this->m_dimstyle_textalign = kAboveLine;
  this->m_arrowtype = 0;
  this->m_angularunits = 0;
  this->m_lengthformat = 0;
  this->m_angleformat = 0;
  this->m_angleresolution = 2;
  this->m_lengthresolution = 2;
  ON_TextStyle::ON_TextStyle(&this->m_v5_text_style,&ON_TextStyle::Default);
  this->m_lengthfactor = 1.0;
  this->m_bAlternate = false;
  this->m_alternate_lengthfactor = 1.0;
  this->m_alternate_lengthformat = 0;
  this->m_alternate_lengthresolution = 2;
  this->m_alternate_angleformat = 0;
  this->m_alternate_angleresolution = 2;
  ON_wString::ON_wString(&this->m_prefix);
  ON_wString::ON_wString(&this->m_suffix);
  ON_wString::ON_wString(&this->m_alternate_prefix);
  ON_wString::ON_wString(&this->m_alternate_suffix);
  this->m_dimextension = 0.0;
  this->m_leaderarrowsize = 1.0;
  this->m_leaderarrowtype = 0;
  this->m_bSuppressExtension1 = false;
  this->m_bSuppressExtension2 = false;
  this->m_field_override_count = 0;
  this->m_tolerance_style = 0;
  this->m_tolerance_resolution = 4;
  this->m_tolerance_upper_value = 0.0;
  this->m_tolerance_lower_value = 0.0;
  this->m_tolerance_height_scale = 1.0;
  this->m_baseline_spacing = 1.0;
  this->m_bDrawMask = false;
  this->m_mask_color_source = 0;
  (this->m_mask_color).field_0 = ON_Color::White.field_0;
  this->m_dimscale = 1.0;
  this->m_dimscale_source = 0;
  (this->m_source_dimstyle).Data1 = 0;
  (this->m_source_dimstyle).Data2 = 0;
  (this->m_source_dimstyle).Data3 = 0;
  (this->m_source_dimstyle).Data4[0] = '\0';
  (this->m_source_dimstyle).Data4[1] = '\0';
  (this->m_source_dimstyle).Data4[2] = '\0';
  (this->m_source_dimstyle).Data4[3] = '\0';
  (this->m_source_dimstyle).Data4[4] = '\0';
  (this->m_source_dimstyle).Data4[5] = '\0';
  (this->m_source_dimstyle).Data4[6] = '\0';
  (this->m_source_dimstyle).Data4[7] = '\0';
  this->m_ext_line_color_source = '\0';
  OVar1 = ON_Color::Black;
  this->m_dim_line_color_source = '\0';
  this->m_arrow_color_source = '\0';
  this->m_text_color_source = '\0';
  (this->m_ext_line_color).field_0 = ON_Color::Black.field_0;
  (this->m_dim_line_color).field_0 = OVar1.field_0;
  (this->m_arrow_color).field_0 = OVar1.field_0;
  (this->m_text_color).field_0 = OVar1.field_0;
  this->m_ext_line_plot_color_source = '\0';
  this->m_dim_line_plot_color_source = '\0';
  this->m_arrow_plot_color_source = '\0';
  this->m_text_plot_color_source = '\0';
  (this->m_ext_line_plot_color).field_0 = OVar1.field_0;
  (this->m_dim_line_plot_color).field_0 = OVar1.field_0;
  (this->m_arrow_plot_color).field_0 = OVar1.field_0;
  (this->m_text_plot_color).field_0 = OVar1.field_0;
  this->m_ext_line_plot_weight_source = '\0';
  this->m_dim_line_plot_weight_source = '\0';
  this->m_ext_line_plot_weight_mm = 0.0;
  this->m_dim_line_plot_weight_mm = 0.0;
  this->m_fixed_extension_len = 1.0;
  this->m_fixed_extension_len_on = false;
  this->m_text_rotation = 0.0;
  this->m_alt_tol_resolution = 4;
  this->m_tol_textheight_fraction = 1.0;
  this->m_suppress_arrow1 = false;
  this->m_suppress_arrow2 = false;
  this->m_textmove_leader = 0;
  this->m_arclength_sym = 0;
  this->m_stack_textheight_fraction = 1.0;
  this->m_stack_format = 0;
  this->m_alt_round = 0.0;
  this->m_round = 0.0;
  this->m_alt_zero_suppress = 0;
  this->m_tol_zero_suppress = 0;
  this->m_zero_suppress = 0;
  this->m_ang_zero_suppress = 0;
  this->m_alt_below = false;
  (this->m_arrow_1).m_arrowhead_type = SolidTriangle;
  (this->m_arrow_1).m_arrow_block_id.Data1 = 0;
  (this->m_arrow_1).m_arrow_block_id.Data2 = 0;
  (this->m_arrow_1).m_arrow_block_id.Data3 = 0;
  (this->m_arrow_1).m_arrow_block_id.Data4[0] = '\0';
  (this->m_arrow_1).m_arrow_block_id.Data4[1] = '\0';
  (this->m_arrow_1).m_arrow_block_id.Data4[2] = '\0';
  (this->m_arrow_1).m_arrow_block_id.Data4[3] = '\0';
  (this->m_arrow_1).m_arrow_block_id.Data4[4] = '\0';
  (this->m_arrow_1).m_arrow_block_id.Data4[5] = '\0';
  (this->m_arrow_1).m_arrow_block_id.Data4[6] = '\0';
  (this->m_arrow_1).m_arrow_block_id.Data4[7] = '\0';
  (this->m_arrow_2).m_arrowhead_type = SolidTriangle;
  (this->m_arrow_2).m_arrow_block_id.Data1 = 0;
  (this->m_arrow_2).m_arrow_block_id.Data2 = 0;
  (this->m_arrow_2).m_arrow_block_id.Data3 = 0;
  (this->m_arrow_2).m_arrow_block_id.Data4[0] = '\0';
  (this->m_arrow_2).m_arrow_block_id.Data4[1] = '\0';
  (this->m_arrow_2).m_arrow_block_id.Data4[2] = '\0';
  (this->m_arrow_2).m_arrow_block_id.Data4[3] = '\0';
  (this->m_arrow_2).m_arrow_block_id.Data4[4] = '\0';
  (this->m_arrow_2).m_arrow_block_id.Data4[5] = '\0';
  (this->m_arrow_2).m_arrow_block_id.Data4[6] = '\0';
  (this->m_arrow_2).m_arrow_block_id.Data4[7] = '\0';
  return;
}

Assistant:

ON_V5x_DimStyle::ON_V5x_DimStyle()
  : ON_ModelComponent(ON_ModelComponent::Type::DimStyle)
{}